

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Salsa20.c
# Opt level: O1

void Hacl_Salsa20_hsalsa20(uint8_t *output,uint8_t *key,uint8_t *nonce)

{
  uint32_t local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_78 = 0x61707865;
  uStack_74 = (undefined4)*(undefined8 *)key;
  uStack_70 = (undefined4)((ulong)*(undefined8 *)key >> 0x20);
  uStack_6c = (undefined4)*(undefined8 *)(key + 8);
  local_68 = (undefined4)((ulong)*(undefined8 *)(key + 8) >> 0x20);
  uStack_64 = 0x3320646e;
  uStack_60 = *(undefined8 *)nonce;
  local_58 = *(undefined8 *)(nonce + 8);
  uStack_50 = 0x79622d32;
  uStack_4c = (undefined4)*(undefined8 *)(key + 0x10);
  local_48 = (undefined4)((ulong)*(undefined8 *)(key + 0x10) >> 0x20);
  uStack_44 = (undefined4)*(undefined8 *)(key + 0x18);
  uStack_40 = (undefined4)((ulong)*(undefined8 *)(key + 0x18) >> 0x20);
  uStack_3c = 0x6b206574;
  Hacl_Impl_Salsa20_rounds(&local_78);
  *(undefined8 *)(output + 0x10) = uStack_60;
  *(undefined8 *)(output + 0x18) = local_58;
  *(uint32_t *)output = local_78;
  *(undefined4 *)(output + 4) = uStack_64;
  *(undefined4 *)(output + 8) = uStack_50;
  *(undefined4 *)(output + 0xc) = uStack_3c;
  return;
}

Assistant:

void Hacl_Salsa20_hsalsa20(uint8_t *output, uint8_t *key, uint8_t *nonce)
{
  Hacl_Impl_HSalsa20_crypto_core_hsalsa20(output, nonce, key);
}